

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

GenerateBlockSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::GenerateBlockSyntax,slang::syntax::GenerateBlockSyntax_const&>
          (BumpAllocator *this,GenerateBlockSyntax *args)

{
  GenerateBlockSyntax *this_00;
  
  this_00 = (GenerateBlockSyntax *)allocate(this,0xc0,8);
  slang::syntax::GenerateBlockSyntax::GenerateBlockSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }